

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroup::InitializeEmpty(RowGroup *this,vector<duckdb::LogicalType,_true> *types)

{
  RowGroupCollection *pRVar1;
  BlockManager *block_manager;
  idx_t start_row;
  type info;
  const_reference type;
  size_type __n;
  shared_ptr<duckdb::ColumnData,_true> column_data;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if ((types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pRVar1 = (this->collection)._M_data;
      block_manager = pRVar1->block_manager;
      info = shared_ptr<duckdb::DataTableInfo,_true>::operator*(&pRVar1->info);
      start_row = (this->super_SegmentBase<duckdb::RowGroup>).start;
      type = vector<duckdb::LogicalType,_true>::operator[](types,__n);
      ColumnData::CreateColumn
                ((ColumnData *)&stack0xffffffffffffffc0,block_manager,info,__n,start_row,type,
                 (optional_ptr<duckdb::ColumnData,_true>)0x0);
      ::std::
      vector<duckdb::shared_ptr<duckdb::ColumnData,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnData,true>>>
      ::emplace_back<duckdb::shared_ptr<duckdb::ColumnData,true>>
                ((vector<duckdb::shared_ptr<duckdb::ColumnData,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnData,true>>>
                  *)&this->columns,(shared_ptr<duckdb::ColumnData,_true> *)&stack0xffffffffffffffc0)
      ;
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(types->
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ).
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(types->
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ).
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  return;
}

Assistant:

void RowGroup::InitializeEmpty(const vector<LogicalType> &types) {
	// set up the segment trees for the column segments
	D_ASSERT(columns.empty());
	for (idx_t i = 0; i < types.size(); i++) {
		auto column_data = ColumnData::CreateColumn(GetBlockManager(), GetTableInfo(), i, start, types[i]);
		columns.push_back(std::move(column_data));
	}
}